

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O0

int __thiscall
vkt::Draw::ShaderDrawParametersTests::init(ShaderDrawParametersTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  mapped_type *ppcVar1;
  TestCaseGroup *pTVar2;
  TestContext *pTVar3;
  TestNode *pTVar4;
  FlagsTestSpec local_438;
  FlagsTestSpec local_400;
  FlagsTestSpec local_3c8;
  FlagsTestSpec local_390;
  DefaultDeleter<tcu::TestCaseGroup> local_351;
  undefined1 local_350 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_2;
  undefined1 local_338 [8];
  TestSpec testSpec_2;
  FlagsTestSpec local_2c8;
  FlagsTestSpec local_290;
  FlagsTestSpec local_258;
  FlagsTestSpec local_220;
  FlagsTestSpec local_1e8;
  DefaultDeleter<tcu::TestCaseGroup> local_1a9;
  undefined1 local_1a8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_1;
  undefined1 local_190 [8];
  TestSpec testSpec_1;
  FlagsTestSpec local_120;
  FlagsTestSpec local_e8;
  FlagsTestSpec local_b0;
  DefaultDeleter<tcu::TestCaseGroup> local_71;
  undefined1 local_70 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  key_type local_4c;
  undefined1 local_48 [8];
  TestSpec testSpec;
  ShaderDrawParametersTests *this_local;
  
  testSpec.super_TestSpecBase._48_8_ = this;
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec((FlagsTestSpec *)local_48);
  local_4c = SHADERTYPE_VERTEX;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_48,&local_4c);
  *ppcVar1 = "vulkan/draw/VertexFetchShaderDrawParameters.vert";
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_ =
       1;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_48,
                         (key_type *)
                         &group.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.field_0x8);
  *ppcVar1 = "vulkan/draw/VertexFetch.frag";
  testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  testSpec.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pTVar3 = tcu::TestNode::getTestContext((TestNode *)this);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,"base_vertex","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_71);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70,pTVar2
            );
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_70);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_b0,(FlagsTestSpec *)local_48);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_b0,0);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_b0);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_70);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_e8,(FlagsTestSpec *)local_48);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_e8,2);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_e8);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_70);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_120,(FlagsTestSpec *)local_48);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_120,4);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_120);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_70);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec
            ((FlagsTestSpec *)&testSpec_1.super_TestSpecBase.topology,(FlagsTestSpec *)local_48);
  Draw::anon_unknown_0::addDrawCase(pTVar2,(TestSpec *)&testSpec_1.super_TestSpecBase.topology,6);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec
            ((FlagsTestSpec *)&testSpec_1.super_TestSpecBase.topology);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70
                   )->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_70);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec((FlagsTestSpec *)local_48);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec((FlagsTestSpec *)local_190);
  group_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = 0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_190,
                         (key_type *)
                         &group_1.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.field_0xc);
  *ppcVar1 = "vulkan/draw/VertexFetchShaderDrawParameters.vert";
  group_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_
       = 1;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_190,
                         (key_type *)
                         &group_1.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.field_0x8);
  *ppcVar1 = "vulkan/draw/VertexFetch.frag";
  testSpec_1.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  testSpec_1.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pTVar3 = tcu::TestNode::getTestContext((TestNode *)this);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,"base_instance","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_1a9);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1a8,
             pTVar2);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_1e8,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_1e8,0);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_1e8);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_220,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_220,2);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_220);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_258,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_258,4);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_258);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_290,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_290,0x14);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_290);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_2c8,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_2c8,6);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_2c8);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec
            ((FlagsTestSpec *)&testSpec_2.super_TestSpecBase.topology,(FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::addDrawCase(pTVar2,(TestSpec *)&testSpec_2.super_TestSpecBase.topology,0x16)
  ;
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec
            ((FlagsTestSpec *)&testSpec_2.super_TestSpecBase.topology);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_1a8)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_1a8);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec((FlagsTestSpec *)local_190);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec((FlagsTestSpec *)local_338);
  group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = 0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_338,
                         (key_type *)
                         &group_2.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.field_0xc);
  *ppcVar1 = "vulkan/draw/VertexFetchShaderDrawParametersDrawIndex.vert";
  group_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_
       = 1;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)local_338,
                         (key_type *)
                         &group_2.
                          super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                          .m_data.field_0x8);
  *ppcVar1 = "vulkan/draw/VertexFetch.frag";
  testSpec_2.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
  testSpec_2.super_TestSpecBase.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xc
  ;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  pTVar3 = tcu::TestNode::getTestContext((TestNode *)this);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,pTVar3,"draw_index","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_351);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_350,
             pTVar2);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_350);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_390,(FlagsTestSpec *)local_338);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_390,0);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_390);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_350);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_3c8,(FlagsTestSpec *)local_338);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_3c8,1);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_3c8);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_350);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_400,(FlagsTestSpec *)local_338);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_400,2);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_400);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_350);
  Draw::anon_unknown_0::FlagsTestSpec::FlagsTestSpec(&local_438,(FlagsTestSpec *)local_338);
  Draw::anon_unknown_0::addDrawCase(pTVar2,&local_438,3);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec(&local_438);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_350)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_350);
  Draw::anon_unknown_0::FlagsTestSpec::~FlagsTestSpec((FlagsTestSpec *)local_338);
  return extraout_EAX;
}

Assistant:

void ShaderDrawParametersTests::init (void)
{
	{
		DrawTest::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX]	= "vulkan/draw/VertexFetchShaderDrawParameters.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT]	= "vulkan/draw/VertexFetch.frag";
		testSpec.topology							= vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		testSpec.flags								= 0;

		de::MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(getTestContext(), "base_vertex", ""));
		addDrawCase(group.get(), testSpec, 0);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDIRECT);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED | TEST_FLAG_INDIRECT);
		addChild(group.release());
	}
	{
		DrawTest::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX]	= "vulkan/draw/VertexFetchShaderDrawParameters.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT]	= "vulkan/draw/VertexFetch.frag";
		testSpec.topology							= vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		testSpec.flags								= TEST_FLAG_INSTANCED;

		de::MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(getTestContext(), "base_instance", ""));
		addDrawCase(group.get(), testSpec, 0);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDIRECT);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDIRECT | TEST_FLAG_FIRST_INSTANCE);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED  | TEST_FLAG_INDIRECT);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED  | TEST_FLAG_INDIRECT | TEST_FLAG_FIRST_INSTANCE);
		addChild(group.release());
	}
	{
		DrawTest::TestSpec testSpec;
		testSpec.shaders[glu::SHADERTYPE_VERTEX]	= "vulkan/draw/VertexFetchShaderDrawParametersDrawIndex.vert";
		testSpec.shaders[glu::SHADERTYPE_FRAGMENT]	= "vulkan/draw/VertexFetch.frag";
		testSpec.topology							= vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
		testSpec.flags								= TEST_FLAG_INDIRECT | TEST_FLAG_MULTIDRAW;

		de::MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(getTestContext(), "draw_index", ""));
		addDrawCase(group.get(), testSpec, 0);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INSTANCED);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED);
		addDrawCase(group.get(), testSpec, TEST_FLAG_INDEXED | TEST_FLAG_INSTANCED);
		addChild(group.release());
	}
}